

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void tmult(double *A,double *B,double *C,int ra,int ca,int cb)

{
  int iVar1;
  double *col;
  double *BT;
  int rb;
  int t;
  int v;
  int u;
  int k;
  int j;
  int i;
  int cb_local;
  int ca_local;
  int ra_local;
  double *C_local;
  double *B_local;
  double *A_local;
  
  col = (double *)malloc((long)ca * 8 * (long)cb);
  mtranspose(B,ca,cb,col);
  for (k = 0; k < ra; k = k + 1) {
    for (u = 0; u < cb; u = u + 1) {
      iVar1 = u + k * cb;
      C[iVar1] = 0.0;
      for (v = 0; v < ca; v = v + 1) {
        C[iVar1] = A[v + k * ca] * col[v + u * ca] + C[iVar1];
      }
    }
  }
  free(col);
  return;
}

Assistant:

void tmult(double* A, double* B, double* C,int ra,int ca, int cb) {
	register int i,j,k;
	int u,v,t,rb;
	double *BT;
	BT = (double*) malloc(sizeof(double) * ca * cb);
	/*
	 * C = A * B , where A is a ra*ca matric while B is a rb*cb
	 * with ca = rb
	 * Matrix C is a ra*cb matrix
	 */ 
	 
	mtranspose(B,ca,cb,BT);
	rb = ca;
	#pragma omp parallel for private(i,j,k,v,u,t)
	for (i = 0; i < ra; ++i) {
		for (j = 0; j < cb; ++j) {
			v = i * rb;
			u = i *cb;
			t = j + u;
			C[t] = 0.;
			for (k = 0; k < rb;++k) {
				C[t] += A[k + v] * BT[k + j * rb];
			}
		}
	}
	
	free(BT);

}